

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetContentRegionMaxAbs(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *window;
  ImGuiContext_conflict *g;
  ImVec2 mx;
  
  pIVar1 = GImGui->CurrentWindow;
  g = *(ImGuiContext_conflict **)&(pIVar1->ContentRegionRect).Max;
  if (((pIVar1->DC).CurrentColumns != (ImGuiOldColumns *)0x0) ||
     (GImGui->CurrentTable != (ImGuiTable *)0x0)) {
    g = (ImGuiContext_conflict *)CONCAT44(SUB84(g,4),(pIVar1->WorkRect).Max.x);
  }
  return (ImVec2)g;
}

Assistant:

ImVec2 ImGui::GetContentRegionMaxAbs()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImVec2 mx = window->ContentRegionRect.Max;
    if (window->DC.CurrentColumns || g.CurrentTable)
        mx.x = window->WorkRect.Max.x;
    return mx;
}